

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O0

JL_STATUS UnmarshalString(JlDataObject *StringObject,_Bool IgnoreExistingValuesInStruct,void *Output
                         )

{
  char *pcVar1;
  char *newString;
  char **OutputStrPtr;
  char *stringPtr;
  void *pvStack_20;
  JL_STATUS jlStatus;
  void *Output_local;
  JlDataObject *pJStack_10;
  _Bool IgnoreExistingValuesInStruct_local;
  JlDataObject *StringObject_local;
  
  OutputStrPtr = (char **)0x0;
  pvStack_20 = Output;
  Output_local._7_1_ = IgnoreExistingValuesInStruct;
  pJStack_10 = StringObject;
  if ((!IgnoreExistingValuesInStruct) && (*Output != 0)) {
    WjTestLib_Free(*Output);
    *(undefined8 *)Output = 0;
  }
  stringPtr._4_4_ = JlGetObjectString(pJStack_10,(char **)&OutputStrPtr);
  if (stringPtr._4_4_ == JL_STATUS_SUCCESS) {
    if (OutputStrPtr == (char **)0x0) {
      stringPtr._4_4_ = JL_STATUS_SUCCESS;
    }
    else {
      pcVar1 = JlStrDup((char *)OutputStrPtr);
      if (pcVar1 == (char *)0x0) {
        stringPtr._4_4_ = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        *(char **)Output = pcVar1;
      }
    }
  }
  return stringPtr._4_4_;
}

Assistant:

static
JL_STATUS
    UnmarshalString
    (
        JlDataObject const*         StringObject,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Output
    )
{
    JL_STATUS jlStatus;
    char const* stringPtr = NULL;
    char** OutputStrPtr = Output;

    if( !IgnoreExistingValuesInStruct && NULL != *OutputStrPtr )
    {
        // Free the existing string here. Note this requires that the string had been allocated by this library
        // on a previous unmarshall, and was not pointing to a static string or junk memory.
        JlFree( *OutputStrPtr );
        *OutputStrPtr = NULL;
    }

    jlStatus = JlGetObjectString( StringObject, &stringPtr );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( NULL != stringPtr )
        {
            char* newString = JlStrDup( stringPtr );
            if( NULL != newString )
            {
                *OutputStrPtr = newString;
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
        else
        {
            // String was a NULL string, so leave it NULL
            jlStatus = JL_STATUS_SUCCESS;
        }
    }

    return jlStatus;
}